

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O3

void __thiscall PrintCCapability::PrintCCapability(PrintCCapability *this)

{
  CapabilityPoint::CapabilityPoint((CapabilityPoint *)this);
  (this->super_PrintLanguageCapability).name._M_dataplus._M_p =
       (pointer)&(this->super_PrintLanguageCapability).name.field_2;
  (this->super_PrintLanguageCapability).name._M_string_length = 0;
  (this->super_PrintLanguageCapability).name.field_2._M_local_buf[0] = '\0';
  (this->super_PrintLanguageCapability).super_CapabilityPoint._vptr_CapabilityPoint =
       (_func_int **)&PTR__PrintLanguageCapability_003ca7e8;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_PrintLanguageCapability).name,0,(char *)0x0,0x34063a);
  (this->super_PrintLanguageCapability).isdefault = true;
  return;
}

Assistant:

PrintCCapability::PrintCCapability(void)

{
  name = "c-language";
  isdefault = true;
}